

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall
iu_Matcher_x_iutest_x_EachAnyOf_Test::Body(iu_Matcher_x_iutest_x_EachAnyOf_Test *this)

{
  bool bVar1;
  detail *this_00;
  LeMatcher<int> *in_RCX;
  AnyOfMatcher<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_> *expected;
  vector<int,_std::allocator<int>_> *v;
  AssertionResult *in_R8;
  string local_2c8;
  string local_2a8;
  AssertionHelper local_288;
  Fixed local_258;
  int local_bc;
  GeMatcher<int> local_b8;
  int local_a4;
  GeMatcher<int> local_a0;
  AnyOfMatcher<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_> local_90;
  EachMatcher<iutest::detail::AnyOfMatcher<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_>_>
  local_68;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_EachAnyOf_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_a4 = 0;
  iutest::matchers::Ge<int>((matchers *)&local_a0,&local_a4);
  local_bc = 10;
  iutest::matchers::Le<int>((matchers *)&local_b8,&local_bc);
  iutest::matchers::AnyOf<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>
            (&local_90,(matchers *)&local_a0,&local_b8,in_RCX);
  iutest::matchers::
  Each<iutest::detail::AnyOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
            (&local_68,(matchers *)&local_90,expected);
  iutest::detail::
  EachMatcher<iutest::detail::AnyOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
  ::operator()((AssertionResult *)local_38,
               (EachMatcher<iutest::detail::AnyOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
                *)&local_68,(vector<int,_std::allocator<int>_> *)(anonymous_namespace)::va);
  iutest::detail::
  EachMatcher<iutest::detail::AnyOfMatcher<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_>_>
  ::~EachMatcher(&local_68);
  iutest::detail::AnyOfMatcher<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_>::
  ~AnyOfMatcher(&local_90);
  iutest::detail::LeMatcher<int>::~LeMatcher((LeMatcher<int> *)&local_b8);
  iutest::detail::GeMatcher<int>::~GeMatcher(&local_a0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_258,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_258);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              (&local_2c8,(iutest *)(anonymous_namespace)::va,v);
    this_00 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_2a8,this_00,"Each(AnyOf( Ge(0), Le(10) ))",local_38,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x39e,&local_2a8,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_288,&local_258);
    iutest::AssertionHelper::~AssertionHelper(&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_258);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(Matcher, EachAnyOf)
{
    IUTEST_EXPECT_THAT(va, Each(AnyOf( Ge(0), Le(10) )));
}